

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O1

pair<vec3f,_vec3f> * __thiscall
BsplineCurve::atParam(pair<vec3f,_vec3f> *__return_storage_ptr__,BsplineCurve *this,double t)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  undefined8 *puVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  double *pdVar17;
  long lVar18;
  int iVar19;
  double dVar20;
  undefined8 uVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  double dVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar39;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dStack_38;
  
  pvVar3 = (this->super_Curve).controls.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = ((long)(this->super_Curve).controls.super__Vector_base<vec3f,_std::allocator<vec3f>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 2) *
           -0x5555555555555555;
  iVar7 = (int)uVar12;
  uVar16 = iVar7 + 3;
  dVar6 = (double)(int)uVar16;
  dVar22 = (double)iVar7 / dVar6 - 3.0 / dVar6;
  dVar20 = t * dVar22 + 3.0 / dVar6;
  pdVar11 = &dStack_38 + (ulong)uVar16 * -4;
  if (0 < (int)uVar16) {
    uVar15 = 0;
    pdVar17 = pdVar11;
    do {
      dVar25 = 0.0;
      if ((double)(int)uVar15 / dVar6 <= dVar20) {
        dVar25 = (double)(-(ulong)(dVar20 < (double)((int)uVar15 + 1) / dVar6) & 0x3ff0000000000000)
        ;
      }
      *pdVar17 = dVar25;
      uVar15 = uVar15 + 1;
      pdVar17 = pdVar17 + 4;
    } while (uVar16 != uVar15);
  }
  uVar14 = iVar7 + 2;
  lVar18 = 1;
  iVar19 = 2;
  do {
    dVar25 = (double)DAT_00158a70;
    dVar23 = DAT_00158a70._8_8_;
    if (lVar18 < (int)uVar16) {
      uVar15 = 0;
      pdVar17 = pdVar11;
      do {
        iVar8 = (int)uVar15;
        auVar29._4_4_ = 0;
        auVar29._0_4_ = (int)lVar18 + iVar8;
        auVar29._8_4_ = iVar8;
        auVar29._12_4_ = 0;
        auVar30._0_8_ = SUB168(auVar29 | _DAT_00158a70,0) - dVar25;
        auVar30._8_8_ = SUB168(auVar29 | _DAT_00158a70,8) - dVar23;
        auVar31._8_8_ = dVar6;
        auVar31._0_8_ = dVar6;
        auVar31 = divpd(auVar30,auVar31);
        uVar15 = uVar15 + 1;
        auVar32._4_4_ = 0;
        auVar32._0_4_ = iVar8 + iVar19;
        auVar32._8_4_ = (int)uVar15;
        auVar32._12_4_ = 0;
        auVar33._0_8_ = SUB168(auVar32 | _DAT_00158a70,0) - dVar25;
        auVar33._8_8_ = SUB168(auVar32 | _DAT_00158a70,8) - dVar23;
        auVar34._8_8_ = dVar6;
        auVar34._0_8_ = dVar6;
        auVar34 = divpd(auVar33,auVar34);
        pdVar17[1] = ((dVar20 - auVar31._8_8_) / (auVar31._0_8_ - auVar31._8_8_)) * *pdVar17 +
                     ((auVar34._0_8_ - dVar20) / (auVar34._0_8_ - auVar34._8_8_)) * pdVar17[4];
        pdVar17 = pdVar17 + 4;
      } while (uVar14 != uVar15);
    }
    lVar18 = lVar18 + 1;
    uVar14 = uVar14 - 1;
    iVar19 = iVar19 + 1;
    pdVar11 = pdVar11 + 1;
  } while (lVar18 != 4);
  if (iVar7 + -1 < 0) {
    uVar21 = 0;
    fVar24 = 0.0;
    fVar26 = 0.0;
    fVar27 = 0.0;
    fVar28 = 0.0;
  }
  else {
    puVar10 = (undefined8 *)(&stack0xfffffffffffffff8 + (ulong)uVar16 * -0x20);
    pfVar9 = &pvVar3->z;
    uVar21 = 0;
    fVar24 = 0.0;
    fVar26 = 0.0;
    fVar27 = 0.0;
    fVar28 = 0.0;
    uVar15 = 0;
    do {
      uVar1 = ((vec3f *)(pfVar9 + -2))->x;
      uVar2 = ((vec3f *)(pfVar9 + -2))->y;
      auVar40._0_4_ = (int)uVar15 + 3;
      uVar13 = uVar15 + 1;
      auVar40._4_4_ = 0;
      auVar40._8_4_ = (int)uVar15 + 4;
      auVar40._12_4_ = 0;
      auVar41._0_8_ = SUB168(auVar40 | _DAT_00158a70,0) - dVar25;
      auVar41._8_8_ = SUB168(auVar40 | _DAT_00158a70,8) - dVar23;
      auVar4._8_8_ = dVar6;
      auVar4._0_8_ = dVar6;
      auVar34 = divpd(auVar41,auVar4);
      auVar36._0_8_ = uVar15 & 0xffffffff;
      auVar36._8_4_ = (int)uVar13;
      auVar36._12_4_ = 0;
      auVar37._0_8_ = SUB168(auVar36 | _DAT_00158a70,0) - dVar25;
      auVar37._8_8_ = SUB168(auVar36 | _DAT_00158a70,8) - dVar23;
      auVar5._8_8_ = dVar6;
      auVar5._0_8_ = dVar6;
      auVar31 = divpd(auVar37,auVar5);
      auVar42._0_8_ = auVar34._0_8_ - auVar31._0_8_;
      auVar42._8_8_ = auVar34._8_8_ - auVar31._8_8_;
      auVar38._8_8_ = *puVar10;
      auVar38._0_8_ = puVar10[-4];
      auVar31 = divpd(auVar38,auVar42);
      fVar35 = (float)(auVar31._0_8_ - auVar31._8_8_);
      fVar39 = (float)(double)puVar10[-3];
      uVar21 = CONCAT44((float)((ulong)uVar21 >> 0x20) + fVar39 * (float)uVar2,
                        (float)uVar21 + fVar39 * (float)uVar1);
      fVar24 = fVar24 + (float)uVar1 * 3.0 * fVar35;
      fVar26 = fVar26 + (float)*(undefined8 *)(pfVar9 + -1) * 3.0 * fVar35;
      fVar27 = fVar27 + (float)((ulong)*(undefined8 *)(pfVar9 + -1) >> 0x20) * 3.0 * fVar35;
      fVar28 = fVar28 + *pfVar9 * fVar39;
      puVar10 = puVar10 + 4;
      pfVar9 = pfVar9 + 3;
      uVar15 = uVar13;
    } while ((uVar12 & 0xffffffff) != uVar13);
  }
  fVar35 = (float)dVar22;
  (__return_storage_ptr__->first).x = (float)(int)uVar21;
  (__return_storage_ptr__->first).y = (float)(int)((ulong)uVar21 >> 0x20);
  (__return_storage_ptr__->first).z = fVar28;
  (__return_storage_ptr__->second).x = fVar35 * fVar24;
  (__return_storage_ptr__->second).y = fVar35 * fVar26;
  (__return_storage_ptr__->second).z = fVar27 * fVar35;
  return __return_storage_ptr__;
}

Assistant:

std::pair<vec3f, vec3f> atParam(double t) const
    {
        const int n = controls.size()-1;
        const int k = 3;
        double tmin = (double)k/(n+k+1);
        double tmax = (double)(n+1)/(n+k+1);
        // de-normalize parameter
        t = tmin + t * (tmax - tmin);

        #define t_(i) ((double)(i)/(n+k+1))
        double B[n+k+1][k+1];
        for (int i=0; i<n+k+1; ++i)
            B[i][0] = (t_(i)<=t && t<t_(i+1))? 1: 0;
        for (int p=1; p<=k; ++p)
            for (int i=0; i+p<n+k+1; ++i)
                B[i][p] = (t-t_(i))/(t_(i+p)-t_(i))*B[i][p-1] + (t_(i+p+1)-t)/(t_(i+p+1)-t_(i+1))*B[i+1][p-1];
        vec3f res(0), der(0);
        double t0=0;
        for (int i=0; i<=n; ++i) {
            res += controls[i] * B[i][k];
            t0 += B[i][k];
            der += controls[i] * k * (B[i][k-1]/(t_(i+k)-t_(i)) - B[i+1][k-1]/(t_(i+k+1)-t_(i+1)));
        }
        #undef t_
        return {res, der * (tmax-tmin)};
    }